

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtIDebugDraw.h
# Opt level: O2

void __thiscall
cbtIDebugDraw::drawSpherePatch
          (cbtIDebugDraw *this,cbtVector3 *center,cbtVector3 *up,cbtVector3 *axis,cbtScalar radius,
          cbtScalar minTh,cbtScalar maxTh,cbtScalar minPs,cbtScalar maxPs,cbtVector3 *color,
          cbtScalar stepDegrees,bool drawCenter)

{
  cbtScalar *pcVar1;
  bool bVar2;
  undefined8 extraout_RAX;
  undefined7 uVar4;
  cbtVector3 *pcVar3;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  cbtVector3 *pcVar9;
  undefined3 in_register_00000089;
  int iVar10;
  long lVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  undefined8 uVar21;
  undefined1 auVar15 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar22 [56];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 in_register_00001344 [12];
  cbtVector3 cVar34;
  cbtScalar radius_local;
  undefined4 local_a94;
  undefined4 local_a90;
  int local_a8c;
  undefined8 local_a88;
  undefined8 uStack_a80;
  cbtScalar local_a78;
  cbtVector3 *local_a68;
  float local_a60;
  int local_a5c;
  float local_a58;
  undefined4 local_a54;
  float local_a50;
  cbtScalar sth;
  cbtScalar local_a48;
  long local_a38;
  cbtVector3 *local_a30;
  cbtScalar local_a28;
  undefined1 local_a18 [16];
  ulong local_a08;
  cbtVector3 *local_a00;
  cbtVector3 *local_9f8;
  long local_9f0;
  float local_9e8;
  undefined4 uStack_9e4;
  undefined4 uStack_9e0;
  undefined4 uStack_9dc;
  undefined1 local_9d8 [16];
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  cbtVector3 arcStart;
  cbtVector3 local_9a8;
  cbtVector3 spole;
  cbtVector3 npole;
  cbtVector3 vA [74];
  cbtVector3 vB [74];
  undefined1 auVar33 [56];
  
  auVar25._4_60_ = in_register_00001244;
  auVar25._0_4_ = minTh;
  auVar33 = in_register_00001244._4_56_;
  auVar22 = in_register_00001204._4_56_;
  local_a54 = CONCAT31(in_register_00000089,drawCenter);
  local_a18 = auVar25._0_16_;
  radius_local = radius;
  local_a78 = maxTh;
  local_a48 = maxPs;
  local_a28 = minPs;
  local_a88._0_4_ = stepDegrees;
  cVar34 = ::operator*(up,&radius_local);
  auVar26._0_8_ = cVar34.m_floats._8_8_;
  auVar26._8_56_ = auVar33;
  auVar16._0_8_ = cVar34.m_floats._0_8_;
  auVar16._8_56_ = auVar22;
  vA[0].m_floats = (cbtScalar  [4])vmovlhps_avx(auVar16._0_16_,auVar26._0_16_);
  auVar22 = ZEXT856(vA[0].m_floats._8_8_);
  cVar34 = ::operator+(center,vA);
  auVar27._0_8_ = cVar34.m_floats._8_8_;
  auVar27._8_56_ = auVar33;
  auVar17._0_8_ = cVar34.m_floats._0_8_;
  auVar17._8_56_ = auVar22;
  npole.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar17._0_16_,auVar27._0_16_);
  auVar22 = ZEXT856(npole.m_floats._8_8_);
  cVar34 = ::operator*(up,&radius_local);
  auVar28._0_8_ = cVar34.m_floats._8_8_;
  auVar28._8_56_ = auVar33;
  auVar18._0_8_ = cVar34.m_floats._0_8_;
  auVar18._8_56_ = auVar22;
  vA[0].m_floats = (cbtScalar  [4])vmovlhps_avx(auVar18._0_16_,auVar28._0_16_);
  auVar22 = ZEXT856(vA[0].m_floats._8_8_);
  local_a68 = vA;
  local_a30 = center;
  cVar34 = ::operator-(center,local_a68);
  auVar29._0_8_ = cVar34.m_floats._8_8_;
  auVar29._8_56_ = auVar33;
  auVar19._0_8_ = cVar34.m_floats._0_8_;
  auVar19._8_56_ = auVar22;
  spole.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar19._0_16_,auVar29._0_16_);
  uVar21 = 0;
  local_a88 = CONCAT44(local_a88._4_4_,(cbtScalar)local_a88 * 0.017453292);
  local_a00 = up;
  local_9f8 = axis;
  cVar34 = cbtVector3::cross(up,axis);
  auVar30._0_8_ = cVar34.m_floats._8_8_;
  auVar30._8_56_ = auVar33;
  local_9c8 = cVar34.m_floats._0_8_;
  local_9d8 = auVar30._0_16_;
  bVar2 = (float)local_a18._0_4_ <= -1.5707964;
  uVar4 = (undefined7)((ulong)extraout_RAX >> 8);
  local_a94 = (undefined4)CONCAT71(uVar4,bVar2);
  local_9e8 = (float)((uint)bVar2 * (int)((cbtScalar)local_a88 + -1.5707964) +
                     (uint)!bVar2 * local_a18._0_4_);
  bVar2 = 1.5707964 <= local_a78;
  local_a90 = (undefined4)CONCAT71(uVar4,bVar2);
  fVar13 = (float)((uint)bVar2 * (int)(1.5707964 - (cbtScalar)local_a88) +
                  (uint)!bVar2 * (int)local_a78);
  uStack_9e4 = local_a18._4_4_;
  uStack_9e0 = local_a18._8_4_;
  uStack_9dc = local_a18._12_4_;
  if (fVar13 < local_9e8) {
    local_a90 = (undefined4)CONCAT71(uVar4,1);
    local_a94 = (undefined4)CONCAT71(uVar4,1);
    fVar13 = 1.5707964 - (cbtScalar)local_a88;
    local_9e8 = (cbtScalar)local_a88 + -1.5707964;
    uStack_9e4 = 0;
    uStack_9e0 = 0;
    uStack_9dc = 0;
  }
  uVar6 = (uint)((fVar13 - local_9e8) / (cbtScalar)local_a88);
  local_a08 = (ulong)uVar6;
  if ((int)uVar6 < 2) {
    local_a08 = 1;
  }
  local_a60 = (fVar13 - local_9e8) / (float)(int)local_a08;
  fVar13 = local_a48 - local_a28;
  bVar2 = local_a48 < local_a28;
  local_a28 = (cbtScalar)
              ((uint)bVar2 * (int)((cbtScalar)local_a88 + -3.1415927) +
              (uint)!bVar2 * (int)local_a28);
  local_a58 = (float)((uint)bVar2 * 0x40490fdb + (uint)!bVar2 * (int)local_a48) - local_a28;
  uVar6 = (uint)(local_a58 / (cbtScalar)local_a88);
  uVar7 = 1;
  if (1 < (int)uVar6) {
    uVar7 = (ulong)uVar6;
  }
  local_a5c = (int)local_a08 + 1;
  iVar8 = 0;
  local_a38 = uVar7 * 0x10;
  local_9f0 = local_a38 + 0x10;
  local_a58 = local_a58 / (float)(int)uVar7;
  pcVar9 = vB;
  uStack_9c0 = uVar21;
  do {
    pcVar3 = pcVar9;
    if (iVar8 == local_a5c) {
      return;
    }
    auVar23._0_4_ = (float)iVar8;
    auVar23._4_12_ = in_register_00001344;
    auVar23 = vfmadd213ss_fma(auVar23,ZEXT416((uint)local_a60),ZEXT416((uint)local_9e8));
    local_a78 = radius_local;
    local_a48 = auVar23._0_4_;
    fVar14 = sinf(local_a48);
    sth = fVar14 * local_a78;
    local_a78 = radius_local;
    local_a48 = cosf(local_a48);
    local_a48 = local_a48 * local_a78;
    bVar12 = iVar8 == (int)local_a08;
    iVar10 = 0;
    bVar5 = (byte)local_a94;
    local_a8c = iVar8;
    for (lVar11 = 0; local_9f0 != lVar11; lVar11 = lVar11 + 0x10) {
      auVar24._0_4_ = (float)iVar10;
      auVar24._4_12_ = in_register_00001344;
      auVar23 = vfmadd213ss_fma(auVar24,ZEXT416((uint)local_a58),ZEXT416((uint)local_a28));
      auVar33 = ZEXT856(auVar23._8_8_);
      local_a88 = CONCAT44(local_a88._4_4_,auVar23._0_4_);
      local_a78 = sinf(auVar23._0_4_);
      local_a50 = cosf((cbtScalar)local_a88);
      local_a50 = local_a50 * local_a48;
      auVar22 = (undefined1  [56])0x0;
      cVar34 = ::operator*(local_9f8,&local_a50);
      auVar31._0_8_ = cVar34.m_floats._8_8_;
      auVar31._8_56_ = auVar33;
      auVar20._0_8_ = cVar34.m_floats._0_8_;
      auVar20._8_56_ = auVar22;
      local_9a8.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar20._0_16_,auVar31._0_16_);
      uVar21 = local_9a8.m_floats._8_8_;
      cVar34 = ::operator+(local_a30,&local_9a8);
      auVar32._0_8_ = cVar34.m_floats._8_8_;
      auVar32._8_56_ = auVar33;
      local_a88 = cVar34.m_floats._0_8_;
      local_a18 = auVar32._0_16_;
      uStack_a80 = uVar21;
      cVar34 = ::operator*(local_a00,&sth);
      pcVar1 = (cbtScalar *)((long)pcVar3->m_floats + lVar11);
      fVar14 = local_a48 * local_a78;
      auVar15._0_4_ = fVar14 * (float)local_9c8 + (cbtScalar)local_a88 + cVar34.m_floats[0];
      auVar15._4_4_ = fVar14 * local_9c8._4_4_ + local_a88._4_4_ + cVar34.m_floats[1];
      auVar15._8_4_ = fVar14 * (float)uStack_9c0 + (float)uStack_a80 + (float)uVar21;
      auVar15._12_4_ = fVar14 * uStack_9c0._4_4_ + uStack_a80._4_4_ + (float)((ulong)uVar21 >> 0x20)
      ;
      auVar23 = vinsertps_avx(auVar15,ZEXT416((uint)(fVar14 * (float)local_9d8._0_4_ +
                                                     (float)local_a18._0_4_ + cVar34.m_floats[2])),
                              0x28);
      *(undefined1 (*) [16])((long)pcVar3->m_floats + lVar11) = auVar23;
      if (local_a8c == 0) {
        pcVar9 = &spole;
        if ((char)local_a90 != '\0') goto LAB_00d4664f;
      }
      else {
        pcVar9 = (cbtVector3 *)((long)local_a68->m_floats + lVar11);
LAB_00d4664f:
        (*this->_vptr_cbtIDebugDraw[4])(this,pcVar9,pcVar1,color);
      }
      if (lVar11 == 0) {
        arcStart.m_floats._0_8_ = *(undefined8 *)pcVar1;
        arcStart.m_floats._8_8_ = *(undefined8 *)(pcVar1 + 2);
      }
      else {
        (*this->_vptr_cbtIDebugDraw[4])(this,(long)pcVar3[-1].m_floats + lVar11,pcVar1,color);
      }
      if ((bVar5 & bVar12) != 0) {
        (*this->_vptr_cbtIDebugDraw[4])(this,&npole,pcVar1,color);
      }
      if ((char)local_a54 != '\0') {
        if (fVar13 < 6.2831855 && !bVar2) {
          pcVar9 = local_a30;
          if ((lVar11 == 0 || local_a38 == lVar11) && (iVar8 == 0 || bVar12)) goto LAB_00d466e4;
        }
        else {
          pcVar9 = &arcStart;
          if (local_a38 == lVar11) {
LAB_00d466e4:
            (*this->_vptr_cbtIDebugDraw[4])(this,pcVar9,pcVar1,color);
          }
        }
      }
      iVar10 = iVar10 + 1;
    }
    iVar8 = local_a8c + 1;
    pcVar9 = local_a68;
    local_a68 = pcVar3;
  } while( true );
}

Assistant:

virtual void drawSpherePatch(const cbtVector3& center, const cbtVector3& up, const cbtVector3& axis, cbtScalar radius,
								 cbtScalar minTh, cbtScalar maxTh, cbtScalar minPs, cbtScalar maxPs, const cbtVector3& color, cbtScalar stepDegrees = cbtScalar(10.f), bool drawCenter = true)
	{
		cbtVector3 vA[74];
		cbtVector3 vB[74];
		cbtVector3 *pvA = vA, *pvB = vB, *pT;
		cbtVector3 npole = center + up * radius;
		cbtVector3 spole = center - up * radius;
		cbtVector3 arcStart;
		cbtScalar step = stepDegrees * SIMD_RADS_PER_DEG;
		const cbtVector3& kv = up;
		const cbtVector3& iv = axis;
		cbtVector3 jv = kv.cross(iv);
		bool drawN = false;
		bool drawS = false;
		if (minTh <= -SIMD_HALF_PI)
		{
			minTh = -SIMD_HALF_PI + step;
			drawN = true;
		}
		if (maxTh >= SIMD_HALF_PI)
		{
			maxTh = SIMD_HALF_PI - step;
			drawS = true;
		}
		if (minTh > maxTh)
		{
			minTh = -SIMD_HALF_PI + step;
			maxTh = SIMD_HALF_PI - step;
			drawN = drawS = true;
		}
		int n_hor = (int)((maxTh - minTh) / step) + 1;
		if (n_hor < 2) n_hor = 2;
		cbtScalar step_h = (maxTh - minTh) / cbtScalar(n_hor - 1);
		bool isClosed = false;
		if (minPs > maxPs)
		{
			minPs = -SIMD_PI + step;
			maxPs = SIMD_PI;
			isClosed = true;
		}
		else if ((maxPs - minPs) >= SIMD_PI * cbtScalar(2.f))
		{
			isClosed = true;
		}
		else
		{
			isClosed = false;
		}
		int n_vert = (int)((maxPs - minPs) / step) + 1;
		if (n_vert < 2) n_vert = 2;
		cbtScalar step_v = (maxPs - minPs) / cbtScalar(n_vert - 1);
		for (int i = 0; i < n_hor; i++)
		{
			cbtScalar th = minTh + cbtScalar(i) * step_h;
			cbtScalar sth = radius * cbtSin(th);
			cbtScalar cth = radius * cbtCos(th);
			for (int j = 0; j < n_vert; j++)
			{
				cbtScalar psi = minPs + cbtScalar(j) * step_v;
				cbtScalar sps = cbtSin(psi);
				cbtScalar cps = cbtCos(psi);
				pvB[j] = center + cth * cps * iv + cth * sps * jv + sth * kv;
				if (i)
				{
					drawLine(pvA[j], pvB[j], color);
				}
				else if (drawS)
				{
					drawLine(spole, pvB[j], color);
				}
				if (j)
				{
					drawLine(pvB[j - 1], pvB[j], color);
				}
				else
				{
					arcStart = pvB[j];
				}
				if ((i == (n_hor - 1)) && drawN)
				{
					drawLine(npole, pvB[j], color);
				}

				if (drawCenter)
				{
					if (isClosed)
					{
						if (j == (n_vert - 1))
						{
							drawLine(arcStart, pvB[j], color);
						}
					}
					else
					{
						if (((!i) || (i == (n_hor - 1))) && ((!j) || (j == (n_vert - 1))))
						{
							drawLine(center, pvB[j], color);
						}
					}
				}
			}
			pT = pvA;
			pvA = pvB;
			pvB = pT;
		}
	}